

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O2

ostream * operator<<(ostream *stream,Request *req)

{
  ostream *poVar1;
  string *psVar2;
  
  poVar1 = std::operator<<(stream,(string *)req);
  poVar1 = std::operator<<(poVar1," ");
  poVar1 = std::operator<<(poVar1,(string *)(req + 0x20));
  poVar1 = std::operator<<(poVar1," HTTP/");
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)poVar1,*(int *)(req + 0x40));
  poVar1 = std::operator<<(poVar1,".");
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)poVar1,*(int *)(req + 0x44));
  std::operator<<(poVar1,"\n");
  for (psVar2 = *(string **)(req + 0x48); psVar2 != *(string **)(req + 0x50); psVar2 = psVar2 + 0x40
      ) {
    poVar1 = std::operator<<(stream,psVar2);
    poVar1 = std::operator<<(poVar1,": ");
    poVar1 = std::operator<<(poVar1,psVar2 + 0x20);
    std::operator<<(poVar1,"\n");
  }
  poVar1 = std::operator<<(stream,*(char **)(req + 0x60));
  std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<(stream,"+ keep-alive: ");
  poVar1 = std::ostream::_M_insert<bool>(SUB81(poVar1,0));
  std::operator<<(poVar1,"\n");
  return stream;
}

Assistant:

std::ostream & operator<< (std::ostream &stream, const httpparser::Request &req)
{
    stream << req.method << " " << req.uri << " HTTP/" 
           << req.versionMajor << "." << req.versionMinor << "\n";
           
    for(std::vector<httpparser::Request::HeaderItem>::const_iterator it = req.headers.begin();
        it != req.headers.end(); ++it)
    {
        stream << it->name << ": " << it->value << "\n";
    }
    
    stream << req.content.data() << "\n";
    stream << "+ keep-alive: " << req.keepAlive << "\n";;
    
    return stream;
}